

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-game.c
# Opt level: O3

void textui_process_command(void)

{
  ulong uVar1;
  ulong uVar2;
  wchar_t count_00;
  _Bool _Var3;
  _Bool _Var4;
  uint in_EAX;
  undefined8 uVar5;
  cmd_info *pcVar6;
  char *pcVar7;
  cmd_info *pcVar8;
  ui_event uVar9;
  keypress kp;
  uchar key;
  char nestkey;
  wchar_t count;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  uVar9 = textui_get_command((int *)((long)&uStack_28 + 4));
  uVar1 = uStack_28;
  uVar5 = uVar9._0_8_;
  uStack_28._0_3_ = (uint3)(ushort)uStack_28;
  uVar2 = uStack_28;
  switch(uVar9.type) {
  case EVT_KBRD:
  case EVT_BUTTON:
    _Var4 = (player->opts).opt[1];
    uStack_28._4_4_ = SUB84(uVar1,4);
    count_00 = uStack_28._4_4_;
    kp._8_4_ = uVar9._8_4_ & 0xff;
    kp.type = (int)uVar5;
    kp.code = (int)((ulong)uVar5 >> 0x20);
    uStack_28 = uVar2;
    _Var3 = textui_process_key(kp,(uchar *)((long)&uStack_28 + 2),count_00);
    if ((ulong)uStack_28._2_1_ != 0 || !_Var3) {
      if (uStack_28._2_1_ == 0x9c) {
        pcVar6 = textui_action_menu_choose();
      }
      else {
        pcVar6 = (cmd_info *)converted_list[_Var4][uStack_28._2_1_];
      }
      if (pcVar6 == (cmd_info *)0x0 || !_Var3) {
        do_cmd_unknown();
      }
      else {
        if ((pcVar6->cmd == CMD_NULL) && (pcVar6->hook == (_func_void *)0x0)) {
          if (pcVar6->cmd == CMD_NULL) {
            pcVar8 = pcVar6;
            do {
              pcVar6 = pcVar8;
              if (pcVar8->hook != (_func_void *)0x0) break;
              if (pcVar8->nested_keymap < L'\x01') {
                return;
              }
              if (n_nested < pcVar8->nested_keymap) {
                return;
              }
              if (pcVar8->nested_prompt == (char *)0x0) {
                return;
              }
              _Var4 = get_com(pcVar8->nested_prompt,(char *)((long)&uStack_28 + 3));
              if (!_Var4) {
                return;
              }
              pcVar6 = (cmd_info *)
                       nested_lists[(long)pcVar8->nested_keymap + -1][uStack_28 >> 0x18 & 0xff];
              if (pcVar6 == (cmd_info *)0x0) {
                pcVar7 = "That is not a valid nested command.";
                if (pcVar8->nested_error != (char *)0x0) {
                  pcVar7 = pcVar8->nested_error;
                }
                msg("%s",pcVar7);
                return;
              }
              pcVar8 = pcVar6;
            } while (pcVar6->cmd == CMD_NULL);
          }
        }
        else {
          _Var4 = key_confirm_command(uStack_28._2_1_);
          if (!_Var4) {
            return;
          }
        }
        if ((pcVar6->prereq == (_func__Bool *)0x0) || (_Var4 = (*pcVar6->prereq)(), _Var4)) {
          if (pcVar6->hook == (_func_void *)0x0) {
            if (pcVar6->cmd != CMD_NULL) {
              cmdq_push_repeat(pcVar6->cmd,uStack_28._4_4_);
            }
          }
          else {
            (*pcVar6->hook)();
          }
        }
      }
    }
    break;
  case EVT_MOUSE:
    uVar9._8_4_ = uVar9._8_4_ & 0xff;
    uVar9._0_4_ = (int)uVar5;
    uVar9._4_1_ = (char)((ulong)uVar5 >> 0x20);
    uVar9._5_1_ = (char)((ulong)uVar5 >> 0x28);
    uVar9._6_1_ = (char)((ulong)uVar5 >> 0x30);
    uVar9._7_1_ = (char)((ulong)uVar5 >> 0x38);
    textui_process_click(uVar9);
    break;
  case EVT_RESIZE:
    do_cmd_redraw();
  }
  return;
}

Assistant:

void textui_process_command(void)
{
	int count = 0;
	bool done = true;
	ui_event e = textui_get_command(&count);
	struct cmd_info *cmd = NULL;
	unsigned char key = '\0';
	int mode = OPT(player, rogue_like_commands) ? KEYMAP_MODE_ROGUE : KEYMAP_MODE_ORIG;

	switch (e.type) {
		case EVT_RESIZE: do_cmd_redraw(); return;
		case EVT_MOUSE: textui_process_click(e); return;
		case EVT_BUTTON:
		case EVT_KBRD: done = textui_process_key(e.key, &key, count); break;
		default: ;
	}

	/* Null command */
	if (!key && done)
		return;

	if (key == KC_ENTER) {
		/* Use command menus */
		cmd = textui_action_menu_choose();
	} else {
		/* Command key */
		cmd = converted_list[mode][key];
	}

	if (cmd && done) {
		if (cmd->cmd || cmd->hook) {
			/* Confirm for worn equipment inscriptions. */
			if (!key_confirm_command(key)) cmd = NULL;
		} else {
			/*
			 * It refers to nested commands.  Get the nested
			 * command.  Those aren't subject to keymaps and
			 * inherit the count.
			 */
			while (cmd && !cmd->cmd && !cmd->hook) {
				char nestkey;

				if (cmd->nested_keymap > 0 &&
						cmd->nested_keymap <= n_nested &&
						cmd->nested_prompt) {
					if (get_com(cmd->nested_prompt, &nestkey)) {
						const char* em =
							cmd->nested_error;

						cmd = nested_lists[cmd->nested_keymap - 1][(unsigned char) nestkey];
						if (!cmd) {
							msg("%s", em ? em : "That is not a valid nested command.");
						}
					} else {
						cmd = NULL;
					}
				} else {
					cmd = NULL;
				}
			}
		}

		/* Check prereqs. */
		if (cmd && cmd->prereq && !cmd->prereq()) cmd = NULL;

		/* Split on type of command */
		if (cmd && cmd->hook)
			/* UI command */
			cmd->hook();
		else if (cmd && cmd->cmd)
			/* Game command */
			cmdq_push_repeat(cmd->cmd, count);
	} else
		/* Error */
		do_cmd_unknown();
}